

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,uint *escapedCodepoint)

{
  uint uVar1;
  uint codepoint;
  uint *escapedCodepoint_local;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
  *ds_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  uVar1 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          ::Take(ds);
  switch(uVar1) {
  case 0x24:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x3f:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x7b:
  case 0x7c:
  case 0x7d:
    *escapedCodepoint = uVar1;
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case 0x66:
    *escapedCodepoint = 0xc;
    this_local._7_1_ = true;
    break;
  case 0x6e:
    *escapedCodepoint = 10;
    this_local._7_1_ = true;
    break;
  case 0x72:
    *escapedCodepoint = 0xd;
    this_local._7_1_ = true;
    break;
  case 0x74:
    *escapedCodepoint = 9;
    this_local._7_1_ = true;
    break;
  case 0x76:
    *escapedCodepoint = 0xb;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CharacterEscape(DecodedStream<InputStream, Encoding>& ds, unsigned* escapedCodepoint) {
        unsigned codepoint;
        switch (codepoint = ds.Take()) {
            case '^':
            case '$':
            case '|':
            case '(':
            case ')':
            case '?':
            case '*':
            case '+':
            case '.':
            case '[':
            case ']':
            case '{':
            case '}':
            case '\\':
                *escapedCodepoint = codepoint; return true;
            case 'f': *escapedCodepoint = 0x000C; return true;
            case 'n': *escapedCodepoint = 0x000A; return true;
            case 'r': *escapedCodepoint = 0x000D; return true;
            case 't': *escapedCodepoint = 0x0009; return true;
            case 'v': *escapedCodepoint = 0x000B; return true;
            default:
                return false; // Unsupported escape character
        }
    }